

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlNameDefn.h
# Opt level: O0

void __thiscall GdlNameDefn::AddExtName(GdlNameDefn *this,utf16 wLangID,GdlExpression *pexp)

{
  GdlExtName *this_00;
  wstring *in_RDX;
  long in_RDI;
  wstring stu;
  GdlStringExpression *pexpString;
  value_type *__x;
  undefined8 local_d8;
  GdlExtName *in_stack_ffffffffffffff40;
  wstring local_b0 [72];
  GdlStringExpression *in_stack_ffffffffffffff98;
  undefined8 local_20;
  
  if (in_RDX == (wstring *)0x0) {
    local_d8 = 0;
  }
  else {
    local_d8 = __dynamic_cast(in_RDX,&GdlExpression::typeinfo,&GdlStringExpression::typeinfo,0);
  }
  local_20 = local_d8;
  __x = (value_type *)&stack0xffffffffffffffc0;
  GdlStringExpression::ConvertToUnicode_abi_cxx11_(in_stack_ffffffffffffff98);
  this_00 = (GdlExtName *)(in_RDI + 0x28);
  std::__cxx11::wstring::wstring(local_b0,(wstring *)__x);
  GdlExtName::GdlExtName(in_stack_ffffffffffffff40,in_RDX,(utf16)((ulong)in_RDI >> 0x30));
  std::vector<GdlExtName,_std::allocator<GdlExtName>_>::push_back
            ((vector<GdlExtName,_std::allocator<GdlExtName>_> *)this_00,__x);
  GdlExtName::~GdlExtName(this_00);
  std::__cxx11::wstring::~wstring(local_b0);
  std::__cxx11::wstring::~wstring((wstring *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void AddExtName(utf16 wLangID, GdlExpression * pexp)
	{
		GdlStringExpression * pexpString = dynamic_cast<GdlStringExpression*>(pexp);
		Assert(pexpString);

		std::wstring stu = pexpString->ConvertToUnicode();
		m_vextname.push_back(GdlExtName(stu, wLangID));
	}